

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlistwidget.cpp
# Opt level: O0

int __thiscall QListWidget::qt_metacall(QListWidget *this,Call _c,int _id,void **_a)

{
  undefined8 *in_RCX;
  int in_ESI;
  QListView *in_RDI;
  long in_FS_OFFSET;
  void **in_stack_00000080;
  int in_stack_00000088;
  Call in_stack_0000008c;
  QObject *in_stack_00000090;
  void **in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  Call in_stack_ffffffffffffffc4;
  int local_28;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = QListView::qt_metacall
                       (in_RDI,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                        in_stack_ffffffffffffffb8);
  if (-1 < local_28) {
    if (in_ESI == 0) {
      if (local_28 < 0xd) {
        qt_static_metacall(in_stack_00000090,in_stack_0000008c,in_stack_00000088,in_stack_00000080);
      }
      local_28 = local_28 + -0xd;
    }
    if (in_ESI == 7) {
      if (local_28 < 0xd) {
        memset(&local_10,0,8);
        QMetaType::QMetaType(&local_10);
        *(QMetaTypeInterface **)*in_RCX = local_10.d_ptr;
      }
      local_28 = local_28 + -0xd;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall(in_stack_00000090,in_stack_0000008c,in_stack_00000088,in_stack_00000080);
      local_28 = local_28 + -3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

int QListWidget::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QListView::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 13)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 13;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 13)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 13;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 3;
    }
    return _id;
}